

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

BIGNUM * BN_lebin2bn(uchar *s,int len,BIGNUM *ret)

{
  BIGNUM *a;
  BIGNUM *pBVar1;
  ulong uVar2;
  ulong uVar3;
  uint words;
  uint uVar5;
  byte *pbVar6;
  bool bVar7;
  ulong uVar4;
  
  if (ret == (BIGNUM *)0x0) {
    a = (BIGNUM *)CRYPTO_zalloc(0x18);
    if (a != (BIGNUM *)0x0) {
      a->flags = 1;
      ret = (BIGNUM *)a;
      goto LAB_00112847;
    }
LAB_00112927:
    ret = (BIGNUM *)0x0;
  }
  else {
    a = (BIGNUM *)0x0;
LAB_00112847:
    pbVar6 = s + len;
    if (len < 1) {
      if (len != 0) {
LAB_00112873:
        uVar5 = len - 1U >> 3;
        uVar3 = (ulong)uVar5;
        words = uVar5 + 1;
        uVar4 = (ulong)words;
        if (((int)uVar5 < ((BIGNUM *)ret)->dmax) ||
           (pBVar1 = bn_expand2((BIGNUM *)ret,words), pBVar1 != (BIGNUM *)0x0)) {
          ((BIGNUM *)ret)->top = words;
          ((BIGNUM *)ret)->neg = 0;
          uVar5 = len - 1U & 7;
          uVar2 = 0;
          do {
            pbVar6 = pbVar6 + -1;
            uVar2 = (ulong)*pbVar6 | uVar2 << 8;
            bVar7 = uVar5 == 0;
            uVar5 = uVar5 - 1;
            if (bVar7) {
              uVar4 = (ulong)((int)uVar4 - 1);
              ((BIGNUM *)ret)->d[uVar4] = uVar2;
              uVar5 = 7;
              uVar2 = 0;
            }
            len = len + -1;
          } while (len != 0);
          do {
            if (((BIGNUM *)ret)->d[uVar3] != 0) {
              ((BIGNUM *)ret)->top = (int)uVar3 + 1;
              if ((int)uVar3 != -1) {
                return ret;
              }
              goto LAB_00112919;
            }
            uVar3 = uVar3 - 1;
          } while (1 < (int)uVar3 + 2);
          ((BIGNUM *)ret)->top = 0;
LAB_00112919:
          ((BIGNUM *)ret)->neg = 0;
          return ret;
        }
        BN_free(a);
        goto LAB_00112927;
      }
    }
    else {
      do {
        if (pbVar6[-1] != 0) goto LAB_00112873;
        pbVar6 = pbVar6 + -1;
        bVar7 = 1 < len;
        len = len + -1;
      } while (bVar7);
    }
    ((BIGNUM *)ret)->top = 0;
  }
  return ret;
}

Assistant:

BIGNUM *BN_lebin2bn(const unsigned char *s, int len, BIGNUM *ret)
{
    unsigned int i, m;
    unsigned int n;
    BN_ULONG l;
    BIGNUM *bn = NULL;

    if (ret == NULL)
        ret = bn = BN_new();
    if (ret == NULL)
        return (NULL);
    bn_check_top(ret);
    s += len;
    /* Skip trailing zeroes. */
    for ( ; len > 0 && s[-1] == 0; s--, len--)
        continue;
    n = len;
    if (n == 0) {
        ret->top = 0;
        return ret;
    }
    i = ((n - 1) / BN_BYTES) + 1;
    m = ((n - 1) % (BN_BYTES));
    if (bn_wexpand(ret, (int)i) == NULL) {
        BN_free(bn);
        return NULL;
    }
    ret->top = i;
    ret->neg = 0;
    l = 0;
    while (n--) {
        s--;
        l = (l << 8L) | *s;
        if (m-- == 0) {
            ret->d[--i] = l;
            l = 0;
            m = BN_BYTES - 1;
        }
    }
    /*
     * need to call this due to clear byte at top if avoiding having the top
     * bit set (-ve number)
     */
    bn_correct_top(ret);
    return ret;
}